

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::overlap_iterator::treeFind
          (overlap_iterator *this)

{
  NodeRef node;
  NodeRef node_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  interval<unsigned_long> *in_RDI;
  uint32_t offset;
  uint32_t size;
  uint32_t offset_1;
  uint32_t size_1;
  uint32_t i;
  NodeRef child;
  Path *path;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_1c;
  
  bVar1 = const_iterator::valid((const_iterator *)0x471208);
  if (bVar1) {
    uVar2 = (uint32_t)((ulong)&in_RDI->right >> 0x20);
    IntervalMapDetails::Path::height
              ((Path *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    IntervalMapDetails::Path::childAt
              ((Path *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),uVar2);
    local_1c = *(int *)(in_RDI->left + 0xc0);
    uVar2 = IntervalMapDetails::Path::height
                      ((Path *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_1c = local_1c - uVar2;
    while (local_1c = local_1c + -1, local_1c != 0) {
      uVar2 = IntervalMapDetails::NodeRef::size((NodeRef *)0x47128a);
      IntervalMapDetails::NodeRef::
      get<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
                ((NodeRef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
              ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                                  *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffc0,in_RDI);
      if (uVar3 == uVar2) {
        const_iterator::setToEnd((const_iterator *)0x4712c7);
        return;
      }
      node.pip.value._4_4_ = in_stack_ffffffffffffffa4;
      node.pip.value._0_4_ = in_stack_ffffffffffffffa0;
      IntervalMapDetails::Path::push
                ((Path *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),node,0);
      IntervalMapDetails::NodeRef::childAt
                ((NodeRef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
    uVar2 = IntervalMapDetails::NodeRef::size((NodeRef *)0x471319);
    bVar1 = const_iterator::isFlat
                      ((const_iterator *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (bVar1) {
      IntervalMapDetails::NodeRef::
      get<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>>
                ((NodeRef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
              ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
                                  *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                 (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffc0,in_RDI);
    }
    else {
      IntervalMapDetails::NodeRef::
      get<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                ((NodeRef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      uVar3 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
              ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
                                  *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                                 (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffc0,in_RDI);
    }
    if (uVar3 == uVar2) {
      const_iterator::setToEnd((const_iterator *)0x471395);
    }
    else {
      node_00.pip.value._4_4_ = uVar3;
      node_00.pip.value._0_4_ = in_stack_ffffffffffffffa0;
      IntervalMapDetails::Path::push
                ((Path *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),node_00,0);
    }
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::treeFind() {
    if (!valid())
        return;

    auto& path = this->path;
    auto child = path.childAt(path.height());
    for (uint32_t i = this->map->height - path.height() - 1; i > 0; i--) {
        uint32_t size = child.size();
        uint32_t offset = child.template get<Branch>().findFirstOverlap(0, size, searchKey);
        if (offset == size) {
            // Note: this branch might be impossible since we won't even enter this
            // function if we aren't overlapping the parent branch.
            this->setToEnd();
            return;
        }

        path.push(child, offset);
        child = child.childAt(offset);
    }

    uint32_t size = child.size();
    uint32_t offset = this->isFlat()
                          ? child.template get<RootLeaf>().findFirstOverlap(0, size, searchKey)
                          : child.template get<Leaf>().findFirstOverlap(0, size, searchKey);
    if (offset == size) {
        this->setToEnd();
        return;
    }

    path.push(child, offset);
}